

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spreadsketch.cpp
# Opt level: O3

void __thiscall DetectorSS::Intersec(DetectorSS *this,uchar *dst,uchar *src,int start,int len)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  
  if (0 < len) {
    uVar2 = 0;
    do {
      iVar6 = (int)(uVar2 + start) >> 3;
      uVar3 = uVar2 + start & 7;
      uVar1 = uVar2 & 7;
      iVar4 = (int)uVar2 >> 3;
      uVar5 = uVar3 - uVar1;
      if (uVar3 < uVar1 || uVar5 == 0) {
        dst[iVar4] = dst[iVar4] &
                     ((byte)(-1 << (8 - uVar1 & 0x1f)) |
                     (byte)((0xffU >> uVar3 & (uint)src[iVar6]) >> (uVar1 - uVar3 & 0x1f)));
        uVar2 = (8 - uVar1) + uVar2;
      }
      else {
        dst[iVar4] = dst[iVar4] &
                     (~(byte)(-1 << (uVar5 & 0x1f)) |
                     (byte)((0xffU >> uVar3 & (uint)src[iVar6]) << (uVar5 & 0x1f)));
        uVar2 = (uVar2 - uVar3) + 8;
      }
    } while ((int)uVar2 < len);
  }
  return;
}

Assistant:

void DetectorSS::Intersec(unsigned char* dst, unsigned char* src, int start, int len) {
	int curlen = 0;
	while (curlen < len) {
		unsigned char temp = 255;
		int n = start + curlen;
		int index = n >> 3;
		int pos = n & 0x07;
		int pos2 = curlen & 0x07;
		if ((8 - pos2) > (8 - pos)) {
			temp &= src[index] & (0xff >> pos);
			temp <<= (pos - pos2);
			temp |= ((1 << (pos - pos2)) - 1);
			dst[curlen >> 3] &= temp;
			curlen += 8 - pos;
		}
		else {
			temp &= src[index] & (0xff >> pos);
			temp >>= (pos2 - pos);
			temp |= 256 - (1 << (8 - pos2));
			dst[curlen >> 3] &= temp;
			curlen += 8 - pos2;
		}
	}
}